

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict declaration_specs(c2m_ctx_t c2m_ctx,int no_err_p,node_t_conflict arg)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  char *format;
  undefined8 uVar3;
  parse_ctx *ppVar4;
  pos_t pVar5;
  pos_t p;
  node_t_conflict n;
  size_t sVar6;
  node *n_00;
  node_t_conflict pnVar7;
  node_t_conflict op1;
  char *pcVar8;
  node_t_conflict arg_00;
  undefined8 uVar9;
  undefined8 uVar10;
  parse_ctx_t parse_ctx_2;
  node_code_t nVar11;
  int iVar12;
  undefined8 uVar13;
  parse_ctx_t parse_ctx;
  bool bVar14;
  pos_t p_00;
  pos_t p_01;
  pos_t p_02;
  node_t_conflict local_80;
  
  ppVar1 = c2m_ctx->parse_ctx;
  ptVar2 = ppVar1->curr_token;
  format = (ptVar2->pos).fname;
  uVar3._0_4_ = (ptVar2->pos).lno;
  uVar3._4_4_ = (ptVar2->pos).ln_pos;
  p = ptVar2->pos;
  n = new_node(c2m_ctx,N_LIST);
  bVar14 = arg != (node_t_conflict)0x0;
  local_80 = (node_t_conflict)0x0;
  do {
    while (ptVar2 = ppVar1->curr_token, pnVar7 = local_80, *(short *)ptVar2 == 0x113) {
      ppVar4 = c2m_ctx->parse_ctx;
      if (*(short *)ppVar4->curr_token == 0x113) {
        pVar5 = ppVar4->curr_token->pos;
        read_token(c2m_ctx);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
          read_token(c2m_ctx);
          sVar6 = record_start(c2m_ctx);
          op1 = type_name(c2m_ctx,1);
          record_stop(c2m_ctx,sVar6,(uint)(op1 == &err_struct));
          if (op1 == &err_struct) {
            op1 = cond_expr(c2m_ctx,no_err_p);
            n_00 = &err_struct;
            if (op1 == &err_struct) goto LAB_00196e55;
          }
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
            read_token(c2m_ctx);
            n_00 = new_pos_node1(c2m_ctx,N_ALIGNAS,pVar5,op1);
          }
          else {
            n_00 = &err_struct;
            if (ppVar4->record_level == 0) {
              iVar12 = 0x29;
              goto LAB_00196e42;
            }
          }
        }
        else {
          n_00 = &err_struct;
          if (ppVar4->record_level == 0) {
            iVar12 = 0x28;
            goto LAB_00196e42;
          }
        }
      }
      else {
        n_00 = &err_struct;
        if (ppVar4->record_level == 0) {
          iVar12 = 0x113;
LAB_00196e42:
          pcVar8 = get_token_name(c2m_ctx,iVar12);
          syntax_error(c2m_ctx,pcVar8);
          n_00 = &err_struct;
        }
      }
LAB_00196e55:
      if (n_00 == &err_struct) goto LAB_00196f01;
LAB_00196e61:
      local_80 = pnVar7;
      op_append(c2m_ctx,n,n_00);
      bVar14 = true;
    }
    pVar5 = ptVar2->pos;
    sVar6 = record_start(c2m_ctx);
    ptVar2 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar2 == 0x136) {
      pcVar8 = (ptVar2->pos).fname;
      uVar9._0_4_ = (ptVar2->pos).lno;
      uVar9._4_4_ = (ptVar2->pos).ln_pos;
      read_token(c2m_ctx);
      nVar11 = N_TYPEDEF;
LAB_00196982:
      n_00 = new_node(c2m_ctx,nVar11);
      p_00.lno = (int)uVar9;
      p_00.ln_pos = (int)((ulong)uVar9 >> 0x20);
      p_00.fname = pcVar8;
      add_pos(c2m_ctx,n_00,p_00);
    }
    else {
      ptVar2 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar2 == 0x125) {
        pcVar8 = (ptVar2->pos).fname;
        uVar10._0_4_ = (ptVar2->pos).lno;
        uVar10._4_4_ = (ptVar2->pos).ln_pos;
        read_token(c2m_ctx);
        nVar11 = N_EXTERN;
      }
      else {
        ptVar2 = c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ptVar2 == 0x133) {
          pcVar8 = (ptVar2->pos).fname;
          uVar10._0_4_ = (ptVar2->pos).lno;
          uVar10._4_4_ = (ptVar2->pos).ln_pos;
          read_token(c2m_ctx);
          nVar11 = N_STATIC;
        }
        else {
          ptVar2 = c2m_ctx->parse_ctx->curr_token;
          if (*(short *)ptVar2 == 0x11a) {
            pcVar8 = (ptVar2->pos).fname;
            uVar10._0_4_ = (ptVar2->pos).lno;
            uVar10._4_4_ = (ptVar2->pos).ln_pos;
            read_token(c2m_ctx);
            nVar11 = N_AUTO;
          }
          else {
            ptVar2 = c2m_ctx->parse_ctx->curr_token;
            if (*(short *)ptVar2 != 0x12d) {
              ptVar2 = c2m_ctx->parse_ctx->curr_token;
              if (*(short *)ptVar2 == 0x118) {
                pcVar8 = (ptVar2->pos).fname;
                uVar9._0_4_ = (ptVar2->pos).lno;
                uVar9._4_4_ = (ptVar2->pos).ln_pos;
                read_token(c2m_ctx);
                if (c2m_ctx->options->pedantic_p == 0) {
                  warning(c2m_ctx,0x1c39fd,pcVar8,uVar9);
                }
                else {
                  error(c2m_ctx,0x1c39dd,pcVar8,uVar9);
                }
                nVar11 = N_THREAD_LOCAL;
                goto LAB_00196982;
              }
              n_00 = &err_struct;
              if (c2m_ctx->parse_ctx->record_level == 0) {
                syntax_error(c2m_ctx,"a storage specifier");
                n_00 = &err_struct;
              }
              goto LAB_00196aa5;
            }
            pcVar8 = (ptVar2->pos).fname;
            uVar10._0_4_ = (ptVar2->pos).lno;
            uVar10._4_4_ = (ptVar2->pos).ln_pos;
            read_token(c2m_ctx);
            nVar11 = N_REGISTER;
          }
        }
      }
      n_00 = new_node(c2m_ctx,nVar11);
      p_01.lno = (int)uVar10;
      p_01.ln_pos = (int)((ulong)uVar10 >> 0x20);
      p_01.fname = pcVar8;
      add_pos(c2m_ctx,n_00,p_01);
    }
LAB_00196aa5:
    record_stop(c2m_ctx,sVar6,(uint)(n_00 == &err_struct));
    iVar12 = (int)sVar6;
    if (n_00 != &err_struct) goto LAB_00196e61;
    sVar6 = record_start(c2m_ctx);
    n_00 = type_qual(c2m_ctx,iVar12);
    record_stop(c2m_ctx,sVar6,(uint)(n_00 == &err_struct));
    if (n_00 != &err_struct) goto LAB_00196e61;
    sVar6 = record_start(c2m_ctx);
    ptVar2 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar2 == 0x12a) {
      pcVar8 = (ptVar2->pos).fname;
      uVar13._0_4_ = (ptVar2->pos).lno;
      uVar13._4_4_ = (ptVar2->pos).ln_pos;
      read_token(c2m_ctx);
      nVar11 = N_INLINE;
LAB_00196b72:
      n_00 = new_node(c2m_ctx,nVar11);
      p_02.lno = (int)uVar13;
      p_02.ln_pos = (int)((ulong)uVar13 >> 0x20);
      p_02.fname = pcVar8;
      add_pos(c2m_ctx,n_00,p_02);
    }
    else {
      ptVar2 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar2 == 0x116) {
        pcVar8 = (ptVar2->pos).fname;
        uVar13._0_4_ = (ptVar2->pos).lno;
        uVar13._4_4_ = (ptVar2->pos).ln_pos;
        read_token(c2m_ctx);
        nVar11 = N_NO_RETURN;
        goto LAB_00196b72;
      }
      n_00 = &err_struct;
      if (c2m_ctx->parse_ctx->record_level == 0) {
        syntax_error(c2m_ctx,"a function specifier");
        n_00 = &err_struct;
      }
    }
    record_stop(c2m_ctx,sVar6,(uint)(n_00 == &err_struct));
    if (n_00 != &err_struct) goto LAB_00196e61;
    if (!bVar14) {
      n_00 = type_spec(c2m_ctx,no_err_p,local_80);
      pnVar7 = n_00;
      if (n_00 == &err_struct) {
LAB_00196f01:
        return &err_struct;
      }
      goto LAB_00196e61;
    }
    n_00 = try_arg_f(c2m_ctx,(nonterm_arg_func_t)local_80,arg_00);
    pnVar7 = n_00;
    if (n_00 != &err_struct) goto LAB_00196e61;
    pnVar7 = try_attr_spec(c2m_ctx,pVar5,(node_t_conflict *)0x0);
    if ((pnVar7 == &err_struct) || (bVar14 = true, pnVar7 == (node_t_conflict)0x0)) {
      if (local_80 == (node_t_conflict)0x0 && arg != (node_t_conflict)0x0) {
        if (c2m_ctx->options->pedantic_p != 0) {
          warning(c2m_ctx,0x1c1b04,format,uVar3);
        }
        pnVar7 = new_node(c2m_ctx,N_INT);
        add_pos(c2m_ctx,pnVar7,p);
        op_append(c2m_ctx,n,pnVar7);
      }
      return n;
    }
  } while( true );
}

Assistant:

DA (declaration_specs) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, r, prev_type_spec = NULL;
  int first_p;
  pos_t pos = curr_token->pos, spec_pos;

  list = new_node (c2m_ctx, N_LIST);
  for (first_p = arg == NULL;; first_p = FALSE) {
    spec_pos = curr_token->pos;
    if (C (T_ALIGNAS)) {
      P (align_spec);
    } else if ((r = TRY (sc_spec)) != err_node) {
    } else if ((r = TRY (type_qual)) != err_node) {
    } else if ((r = TRY (func_spec)) != err_node) {
    } else if (first_p) {
      PA (type_spec, prev_type_spec);
      prev_type_spec = r;
    } else if ((r = TRY_A (type_spec, prev_type_spec)) != err_node) {
      prev_type_spec = r;
    } else if ((r = try_attr_spec (c2m_ctx, spec_pos, FALSE)) != err_node && r != NULL) {
      continue; /* ignore attrs for declaration specs (type attrs) */
    } else
      break;
    op_append (c2m_ctx, list, r);
  }
  if (prev_type_spec == NULL && arg != NULL) {
    if (c2m_options->pedantic_p) warning (c2m_ctx, pos, "type defaults to int");
    r = new_pos_node (c2m_ctx, N_INT, pos);
    op_append (c2m_ctx, list, r);
  }
  return list;
}